

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O2

void test_qlist_insert(void)

{
  QDATA *pQVar1;
  QLIST_NODE *pQVar2;
  int iVar3;
  int iVar4;
  QLIST_NODE *pQVar5;
  QLIST_NODE local_50;
  QLIST_NODE *local_48;
  undefined4 local_40;
  QLIST_NODE local_38;
  
  local_50.n = &local_50;
  local_48 = &local_50;
  pQVar1 = alloc_qdata(5);
  (pQVar1->list_node).n = local_50.n;
  local_50.n = &pQVar1->list_node;
  if (local_48 == &local_50) {
    local_48 = local_50.n;
  }
  pQVar1 = alloc_qdata(3);
  (pQVar1->list_node).n = local_50.n;
  pQVar5 = &pQVar1->list_node;
  if (local_48 == &local_50) {
    local_48 = pQVar5;
  }
  local_50.n = pQVar5;
  pQVar1 = alloc_qdata(4);
  (pQVar1->list_node).n = pQVar5->n;
  pQVar5->n = &pQVar1->list_node;
  if (local_48 == pQVar5) {
    local_48 = &pQVar1->list_node;
  }
  iVar3 = 1;
  pQVar1 = alloc_qdata(1);
  (pQVar1->list_node).n = local_50.n;
  pQVar5 = &pQVar1->list_node;
  if (local_48 == &local_50) {
    local_48 = pQVar5;
  }
  local_50.n = pQVar5;
  pQVar1 = alloc_qdata(2);
  (pQVar1->list_node).n = pQVar5->n;
  pQVar5->n = &pQVar1->list_node;
  if (local_48 == pQVar5) {
    local_48 = &pQVar1->list_node;
  }
  iVar4 = 6;
  pQVar1 = alloc_qdata(6);
  (pQVar1->list_node).n = &local_50;
  pQVar2 = &pQVar1->list_node;
  local_48->n = pQVar2;
  local_48 = pQVar2;
  local_40 = 0x29a;
  local_38.n = (local_50.n)->n;
  (local_50.n)->n = &local_38;
  (local_50.n)->n = local_38.n;
  pQVar5 = &local_50;
  if (pQVar2 == local_50.n) {
    local_48 = local_50.n;
  }
  while (pQVar5 = pQVar5->n, pQVar5 != &local_50) {
    acutest_check_((uint)(iVar3 == ((QDATA *)(pQVar5 + -1))->value),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                   ,0x160,"%s","data->value == n");
    iVar3 = iVar3 + 1;
  }
  while (local_50.n != &local_50) {
    if (local_48 == local_50.n) {
      local_48 = &local_50;
    }
    pQVar1 = (QDATA *)(local_50.n + -1);
    local_50.n = (local_50.n)->n;
    free(pQVar1);
    iVar4 = iVar4 + -1;
  }
  acutest_check_((uint)(iVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x16b,"%s","n == 6");
  return;
}

Assistant:

static void
test_qlist_insert(void)
{
    QLIST list;
    QLIST_NODE* node;
    QDATA* data;
    QDATA xxx;
    int n;

    /* Create simple list. */
    qlist_init(&list);
    qlist_prepend(&list, &alloc_qdata(5)->list_node);                           /* 5 */
    qlist_prepend(&list, &alloc_qdata(3)->list_node);                           /* 3 -> 5 */
    qlist_insert_after(&list, qlist_head(&list), &alloc_qdata(4)->list_node);   /* 3 -> 4 -> 5 */
    qlist_prepend(&list, &alloc_qdata(1)->list_node);                           /* 1 -> 3 -> 4 -> 5 */
    qlist_insert_after(&list, qlist_head(&list), &alloc_qdata(2)->list_node);   /* 1 -> 2 -> 3 -> 4 -> 5 */
    qlist_append(&list, &alloc_qdata(6)->list_node);                            /* 1 -> 2 -> 3 -> 4 -> 5 -> 6 */

    /* Verify that removals do not break integrity. */
    xxx.value = 666;
    qlist_prepend(&list, &xxx.list_node);
    qlist_remove_head(&list);
    qlist_insert_after(&list, qlist_head(&list), &xxx.list_node);
    qlist_remove(&list, qlist_head(&list), &xxx.list_node);

    /* Iterate forward. */
    for(node = qlist_head(&list), n = 1; node != qlist_end(&list); node = qlist_next(node), n++) {
        data = QLIST_DATA(node, QDATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Clean up. */
    n = 0;
    while(!qlist_is_empty(&list)) {
        node = qlist_head(&list);
        qlist_remove_head(&list);
        free(QLIST_DATA(node, QDATA, list_node));
        n++;
    }
    TEST_CHECK(n == 6);
}